

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O0

void nni_posix_udp_cb(void *arg,uint events)

{
  int iVar1;
  int rv;
  nni_plat_udp *udp;
  uint events_local;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x70));
  if ((events & 1) != 0) {
    nni_posix_udp_dorecv((nni_plat_udp *)arg);
  }
  if ((events & 4) != 0) {
    nni_posix_udp_dosend((nni_plat_udp *)arg);
  }
  if ((events & 0x38) == 0) {
    udp._4_4_ = 0;
    iVar1 = nni_list_empty((nni_list *)((long)arg + 0x58));
    if (iVar1 == 0) {
      udp._4_4_ = 4;
    }
    iVar1 = nni_list_empty((nni_list *)((long)arg + 0x40));
    if (iVar1 == 0) {
      udp._4_4_ = udp._4_4_ | 1;
    }
    if ((udp._4_4_ != 0) && (iVar1 = nni_posix_pfd_arm((nni_posix_pfd *)arg,udp._4_4_), iVar1 != 0))
    {
      nni_posix_udp_doerror((nni_plat_udp *)arg,iVar1);
    }
  }
  else {
    nni_posix_udp_doclose((nni_plat_udp *)arg);
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x70));
  return;
}

Assistant:

static void
nni_posix_udp_cb(void *arg, unsigned events)
{
	nni_plat_udp *udp = arg;

	nni_mtx_lock(&udp->udp_mtx);
	if (events & NNI_POLL_IN) {
		nni_posix_udp_dorecv(udp);
	}
	if (events & NNI_POLL_OUT) {
		nni_posix_udp_dosend(udp);
	}
	if (events & (NNI_POLL_HUP | NNI_POLL_ERR | NNI_POLL_INVAL)) {
		nni_posix_udp_doclose(udp);
	} else {
		events = 0;
		if (!nni_list_empty(&udp->udp_sendq)) {
			events |= NNI_POLL_OUT;
		}
		if (!nni_list_empty(&udp->udp_recvq)) {
			events |= NNI_POLL_IN;
		}
		if (events) {
			int rv;
			rv = nni_posix_pfd_arm(&udp->udp_pfd, events);
			if (rv != 0) {
				nni_posix_udp_doerror(udp, rv);
			}
		}
	}
	nni_mtx_unlock(&udp->udp_mtx);
}